

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError getnum(long *val,char *str,int base)

{
  char *pcVar1;
  ParameterError PVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  ParameterError PVar6;
  char *endptr;
  char *local_38;
  
  PVar6 = PARAM_BAD_NUMERIC;
  PVar2 = PVar6;
  if (str != (char *)0x0) {
    local_38 = (char *)0x0;
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(str,&local_38,base);
    pcVar1 = local_38;
    PVar2 = PARAM_NUMBER_TOO_LARGE;
    if (((*piVar3 != 0x22) && (PVar2 = PVar6, local_38 != str)) &&
       (sVar5 = strlen(str), pcVar1 == str + sVar5)) {
      *val = lVar4;
      PVar2 = PARAM_OK;
    }
  }
  return PVar2;
}

Assistant:

static ParameterError getnum(long *val, const char *str, int base)
{
  if(str) {
    char *endptr = NULL;
    long num;
    errno = 0;
    num = strtol(str, &endptr, base);
    if(errno == ERANGE)
      return PARAM_NUMBER_TOO_LARGE;
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}